

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O1

optional<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_> * __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void,_supermap::Key<3UL>_>
::find(optional<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_>
       *__return_storage_ptr__,
      SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void,_supermap::Key<3UL>_>
      *this,Key<3UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_&,_const_supermap::Key<3UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_&,_const_supermap::Key<3UL>_&)>
            *equal)

{
  optional<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_> *poVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_> firstLeqElem;
  undefined2 local_58;
  uchar local_56;
  undefined4 *local_50;
  function<bool_(const_supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_&,_const_supermap::Key<3UL>_&)>
  *local_48;
  Key<3UL> *local_40;
  optional<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_> *local_38;
  
  local_40 = pattern;
  iVar3 = (*(this->
            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
            ).
            super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
            .
            super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
            ._vptr_OrderedStorage[1])(this);
  if (CONCAT44(extraout_var,iVar3) != 0) {
    local_48 = equal;
    local_38 = __return_storage_ptr__;
    iVar3 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
              ._vptr_OrderedStorage[1])(this);
    if (CONCAT44(extraout_var_00,iVar3) < 2) {
      uVar9 = 0;
    }
    else {
      uVar5 = CONCAT44(extraout_var_00,iVar3);
      uVar8 = 0;
      do {
        uVar7 = uVar8 + uVar5 >> 1;
        (*(this->
          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
          ).
          super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
          .
          super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
          ._vptr_OrderedStorage[4])(&local_58,this,uVar7);
        if (*(long *)(less + 0x10) == 0) {
LAB_0019109d:
          std::__throw_bad_function_call();
        }
        cVar2 = (**(code **)(less + 0x18))(less,&local_58,local_40);
        uVar6 = uVar5;
        uVar9 = uVar7;
        if (cVar2 == '\0') {
          if (*(long *)(local_48 + 0x10) == 0) goto LAB_0019109d;
          cVar2 = (**(code **)(local_48 + 0x18))(local_48,&local_58,local_40);
          uVar6 = uVar7;
          uVar9 = uVar8;
          if (cVar2 != '\0') {
            uVar6 = uVar5;
            uVar9 = uVar7;
          }
        }
        if (local_50 != (undefined4 *)0x0) {
          operator_delete__(local_50);
        }
        uVar5 = uVar6;
        uVar8 = uVar9;
      } while (1 < uVar6 - uVar9);
    }
    iVar3 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
              ._vptr_OrderedStorage[1])(this);
    __return_storage_ptr__ = local_38;
    if (uVar9 < CONCAT44(extraout_var_01,iVar3)) {
      (*(this->
        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
        ).
        super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
        ._vptr_OrderedStorage[4])(&local_58,this,uVar9);
      if (*(long *)(local_48 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      cVar2 = (**(code **)(local_48 + 0x18))(local_48,&local_58,local_40);
      poVar1 = local_38;
      if (cVar2 != '\0') {
        (local_38->
        super__Optional_base<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_true,_false,_false>
        .
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_>
        ._M_payload._M_value.key.super_array<unsigned_char,_3UL>._M_elems[2] = local_56;
        *(undefined2 *)
         &(local_38->
          super__Optional_base<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_true,_false,_false>
          .
          super__Optional_payload_base<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_>
          ._M_payload = local_58;
        puVar4 = (undefined4 *)operator_new__(4);
        *puVar4 = 0;
        *(undefined4 **)
         ((long)&(poVar1->
                 super__Optional_base<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_>
                 ._M_payload + 8) = puVar4;
        *puVar4 = *local_50;
      }
      (poVar1->
      super__Optional_base<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_true,_false,_false>
      .
      super__Optional_payload_base<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_>
      ._M_engaged = cVar2 != '\0';
      if (local_50 == (undefined4 *)0x0) {
        return poVar1;
      }
      operator_delete__(local_50);
      return poVar1;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_true,_false,_false>
  .super__Optional_payload_base<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_>.
  _M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }